

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O3

int __thiscall S2CopyingEdgeCrosser::CrossingSign(S2CopyingEdgeCrosser *this,S2Point *c,S2Point *d)

{
  S2Point *p;
  double dVar1;
  double dVar2;
  VType VVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  S2LogMessage SStack_28;
  
  p = &this->c_;
  lVar5 = 0;
  do {
    dVar1 = *(double *)((long)c->c_ + lVar5);
    dVar2 = *(double *)((long)(this->c_).c_ + lVar5);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
    bVar6 = lVar5 != 0x10;
    lVar5 = lVar5 + 8;
  } while (bVar6);
  if (((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) || ((this->crosser_).c_ == (S2Point *)0x0)) {
    (this->c_).c_[2] = c->c_[2];
    VVar3 = c->c_[1];
    p->c_[0] = c->c_[0];
    (this->c_).c_[1] = VVar3;
    bVar6 = S2::IsUnitLength(p);
    if (!bVar6) {
      S2LogMessage::S2LogMessage
                (&SStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
                 ,0x102,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_28.stream_,"Check failed: S2::IsUnitLength(*c) ",0x23);
      abort();
    }
    (this->crosser_).c_ = p;
    iVar4 = s2pred::TriageSign((this->crosser_).a_,(this->crosser_).b_,p,
                               &(this->crosser_).a_cross_b_);
    (this->crosser_).acb_ = -iVar4;
  }
  iVar4 = CrossingSign(this,d);
  return iVar4;
}

Assistant:

inline int S2CopyingEdgeCrosser::CrossingSign(const S2Point& c,
                                              const S2Point& d) {
  if (c != c_ || crosser_.c_ == nullptr) RestartAt(c);
  return CrossingSign(d);
}